

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O3

string * __thiscall
helics::ActionMessage::to_string_abi_cxx11_(string *__return_storage_ptr__,ActionMessage *this)

{
  int iVar1;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->flags & 0x40) == 0) {
    iVar1 = serializedByteCount(this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,(long)iVar1,'\0');
    toByteArray(this,(byte *)(__return_storage_ptr__->_M_dataplus)._M_p,(long)iVar1);
  }
  else {
    to_json_string_abi_cxx11_(&local_40,this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ActionMessage::to_string() const
{
    std::string data;
    if (checkActionFlag(*this, use_json_serialization_flag)) {
        data = to_json_string();
    } else {
        auto size = serializedByteCount();
        data.resize(size);
        toByteArray(reinterpret_cast<std::byte*>(data.data()), size);
    }
    return data;
}